

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseClient.cpp
# Opt level: O2

bool __thiscall
xmrig::BaseClient::handleResponse(BaseClient *this,int64_t id,Value *result,Value *error)

{
  iterator __position;
  uint64_t uVar1;
  bool __args_1;
  int64_t id_local;
  
  if (id != 1) {
    id_local = id;
    __position = std::
                 _Rb_tree<long,_std::pair<const_long,_xmrig::BaseClient::SendResult>,_std::_Select1st<std::pair<const_long,_xmrig::BaseClient::SendResult>_>,_std::less<long>,_std::allocator<std::pair<const_long,_xmrig::BaseClient::SendResult>_>_>
                 ::find(&(this->m_callbacks)._M_t,&id_local);
    if ((_Rb_tree_header *)__position._M_node !=
        &(this->m_callbacks)._M_t._M_impl.super__Rb_tree_header) {
      uVar1 = Chrono::steadyMSecs();
      __args_1 = (error->data_).f.flags != 3;
      if (!__args_1) {
        result = error;
      }
      std::
      function<void_(const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_&,_bool,_unsigned_long)>
      ::operator()((function<void_(const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_&,_bool,_unsigned_long)>
                    *)&__position._M_node[1]._M_parent,result,__args_1,
                   uVar1 - (long)__position._M_node[2]._M_parent);
      std::
      _Rb_tree<long,std::pair<long_const,xmrig::BaseClient::SendResult>,std::_Select1st<std::pair<long_const,xmrig::BaseClient::SendResult>>,std::less<long>,std::allocator<std::pair<long_const,xmrig::BaseClient::SendResult>>>
      ::erase_abi_cxx11_((_Rb_tree<long,std::pair<long_const,xmrig::BaseClient::SendResult>,std::_Select1st<std::pair<long_const,xmrig::BaseClient::SendResult>>,std::less<long>,std::allocator<std::pair<long_const,xmrig::BaseClient::SendResult>>>
                          *)&this->m_callbacks,__position);
      return true;
    }
  }
  return false;
}

Assistant:

bool xmrig::BaseClient::handleResponse(int64_t id, const rapidjson::Value &result, const rapidjson::Value &error)
{
    if (id == 1) {
        return false;
    }

    auto it = m_callbacks.find(id);
    if (it != m_callbacks.end()) {
        const uint64_t elapsed = Chrono::steadyMSecs() - it->second.ts;

        if (error.IsObject()) {
            it->second.callback(error, false, elapsed);
        }
        else {
            it->second.callback(result, true, elapsed);
        }

        m_callbacks.erase(it);

        return true;
    }

    return false;
}